

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O0

void __thiscall FScriptLoader::ParseInfoCmd(FScriptLoader *this,char *line,FString *scriptsrc)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  FString *this_00;
  char *pcVar4;
  char *comm_1;
  char *beg_1;
  char *comm;
  char *beg;
  undefined1 local_128 [8];
  FScanner sc;
  char *temp;
  FString *scriptsrc_local;
  char *line_local;
  FScriptLoader *this_local;
  
  for (sc._248_8_ = line; *(char *)sc._248_8_ != '\0'; sc._248_8_ = sc._248_8_ + 1) {
    if (*(char *)sc._248_8_ < ' ') {
      *(undefined1 *)sc._248_8_ = 0x20;
    }
  }
  scriptsrc_local = (FString *)line;
  if (this->readtype != RT_SCRIPT) {
    sVar3 = strlen(line);
    sc._248_8_ = line + sVar3;
    while (sc._248_8_ = sc._248_8_ + -1, *(char *)sc._248_8_ == ' ') {
      *(undefined1 *)sc._248_8_ = 0;
    }
    for (; *(char *)&scriptsrc_local->Chars == ' ';
        scriptsrc_local = (FString *)((long)&scriptsrc_local->Chars + 1)) {
    }
    if (*(char *)&scriptsrc_local->Chars == '\0') {
      return;
    }
    if ((*(char *)&scriptsrc_local->Chars == '/') &&
       (*(char *)((long)&scriptsrc_local->Chars + 1) == '/')) {
      return;
    }
    if (*(char *)&scriptsrc_local->Chars == '#') {
      return;
    }
    if (*(char *)&scriptsrc_local->Chars == ';') {
      return;
    }
  }
  if (*(char *)&scriptsrc_local->Chars == '[') {
    pcVar4 = (char *)((long)&scriptsrc_local->Chars + 1);
    iVar2 = strncasecmp(pcVar4,"scripts",7);
    if (iVar2 == 0) {
      this->readtype = RT_SCRIPT;
      this->HasScripts = true;
    }
    else {
      iVar2 = strncasecmp(pcVar4,"level info",10);
      if (iVar2 == 0) {
        this->readtype = RT_INFO;
      }
    }
  }
  else if (this->readtype == RT_SCRIPT) {
    this_00 = FString::operator<<(scriptsrc,(char *)scriptsrc_local);
    FString::operator<<(this_00,'\n');
  }
  else if (this->readtype == RT_INFO) {
    FScanner::FScanner((FScanner *)local_128);
    sVar3 = strlen((char *)scriptsrc_local);
    FScanner::OpenMem((FScanner *)local_128,"LEVELINFO",(char *)scriptsrc_local,(int)sVar3);
    FScanner::SetCMode((FScanner *)local_128,true);
    FScanner::MustGetString((FScanner *)local_128);
    bVar1 = FScanner::Compare((FScanner *)local_128,"levelname");
    if (bVar1) {
      comm = strchr((char *)scriptsrc_local,0x3d);
      do {
        comm = comm + 1;
      } while (*comm < '!');
      pcVar4 = strstr(comm,"//");
      if (pcVar4 != (char *)0x0) {
        *pcVar4 = '\0';
      }
      FString::operator=(&::level.LevelName,comm);
    }
    else {
      bVar1 = FScanner::Compare((FScanner *)local_128,"partime");
      if (bVar1) {
        FScanner::MustGetStringName((FScanner *)local_128,"=");
        FScanner::MustGetNumber((FScanner *)local_128);
        ::level.partime = sc.StringLen;
      }
      else {
        bVar1 = FScanner::Compare((FScanner *)local_128,"music");
        if (bVar1) {
          FScanner::MustGetStringName((FScanner *)local_128,"=");
          FScanner::MustGetString((FScanner *)local_128);
          bVar1 = FS_ChangeMusic((char *)local_128);
          if (!bVar1) {
            pcVar4 = FString::operator_cast_to_char_(&::level.Music);
            S_ChangeMusic(pcVar4,::level.musicorder,true,false);
          }
        }
        else {
          bVar1 = FScanner::Compare((FScanner *)local_128,"skyname");
          if (bVar1) {
            FScanner::MustGetStringName((FScanner *)local_128,"=");
            FScanner::MustGetString((FScanner *)local_128);
            sky1texture = FTextureManager::GetTexture(&TexMan,(char *)local_128,1,6);
            sky2texture.texnum = sky1texture.texnum;
            ::level.skytexture1 = sky1texture;
            ::level.skytexture2 = sky1texture;
            R_InitSkyMap();
          }
          else {
            bVar1 = FScanner::Compare((FScanner *)local_128,"interpic");
            if (bVar1) {
              FScanner::MustGetStringName((FScanner *)local_128,"=");
              FScanner::MustGetString((FScanner *)local_128);
              FString::operator=(&(::level.info)->ExitPic,(char *)local_128);
            }
            else {
              bVar1 = FScanner::Compare((FScanner *)local_128,"gravity");
              if (bVar1) {
                FScanner::MustGetStringName((FScanner *)local_128,"=");
                FScanner::MustGetNumber((FScanner *)local_128);
                ::level.gravity = (double)((float)sc.StringLen * 8.0);
              }
              else {
                bVar1 = FScanner::Compare((FScanner *)local_128,"nextlevel");
                if (bVar1) {
                  FScanner::MustGetStringName((FScanner *)local_128,"=");
                  FScanner::MustGetString((FScanner *)local_128);
                  FString::operator=(&::level.NextMap,(char *)local_128);
                }
                else {
                  bVar1 = FScanner::Compare((FScanner *)local_128,"nextsecret");
                  if (bVar1) {
                    FScanner::MustGetStringName((FScanner *)local_128,"=");
                    FScanner::MustGetString((FScanner *)local_128);
                    FString::operator=(&::level.NextSecretMap,(char *)local_128);
                  }
                  else {
                    bVar1 = FScanner::Compare((FScanner *)local_128,"drown");
                    if (bVar1) {
                      FScanner::MustGetStringName((FScanner *)local_128,"=");
                      FScanner::MustGetNumber((FScanner *)local_128);
                      this->drownflag = (uint)(sc.StringLen != 0);
                    }
                    else {
                      bVar1 = FScanner::Compare((FScanner *)local_128,"consolecmd");
                      if (bVar1) {
                        comm_1 = strchr((char *)scriptsrc_local,0x3d);
                        do {
                          comm_1 = comm_1 + 1;
                        } while (*comm_1 < ' ');
                        pcVar4 = strstr(comm_1,"//");
                        if (pcVar4 != (char *)0x0) {
                          *pcVar4 = '\0';
                        }
                        FS_EmulateCmd(comm_1);
                      }
                      else {
                        bVar1 = FScanner::Compare((FScanner *)local_128,"ignore");
                        if (bVar1) {
                          FScanner::MustGetStringName((FScanner *)local_128,"=");
                          FScanner::MustGetNumber((FScanner *)local_128);
                          this->IgnoreInfo = sc.StringLen != 0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    FScanner::Close((FScanner *)local_128);
    FScanner::~FScanner((FScanner *)local_128);
  }
  return;
}

Assistant:

void FScriptLoader::ParseInfoCmd(char *line, FString &scriptsrc)
{
	char *temp;
	
	// clear any control chars
	for(temp=line; *temp; temp++) if (*temp<32) *temp=32;

	if(readtype != RT_SCRIPT)       // not for scripts
	{
		temp = line+strlen(line)-1;

		// strip spaces at the beginning and end of the line
		while(*temp == ' ')	*temp-- = 0;
		while(*line == ' ') line++;
		
		if(!*line) return;
		
		if((line[0] == '/' && line[1] == '/') ||     // comment
			line[0] == '#' || line[0] == ';') return;
	}
	
	if(*line == '[')                // a new section seperator
	{
		line++;
		
		if(!strnicmp(line, "scripts", 7))
		{
			readtype = RT_SCRIPT;
			HasScripts = true;    // has scripts
		}
		else if (!strnicmp(line, "level info", 10))
		{
			readtype = RT_INFO;
		}
		return;
	}
	
	if (readtype==RT_SCRIPT)
	{
		scriptsrc << line << '\n';
	}
	else if (readtype==RT_INFO)
	{
		// Read the usable parts of the level info header 
		// and ignore the rest.
		FScanner sc;
		sc.OpenMem("LEVELINFO", line, (int)strlen(line));
		sc.SetCMode(true);
		sc.MustGetString();
		if (sc.Compare("levelname"))
		{
			char * beg = strchr(line, '=')+1;
			while (*beg<=' ') beg++;
			char * comm = strstr(beg, "//");
			if (comm) *comm=0;
			level.LevelName = beg;
		}
		else if (sc.Compare("partime"))
		{
			sc.MustGetStringName("=");
			sc.MustGetNumber();
			level.partime=sc.Number;
		}
		else if (sc.Compare("music"))
		{
			bool FS_ChangeMusic(const char * string);

			sc.MustGetStringName("=");
			sc.MustGetString();
			if (!FS_ChangeMusic(sc.String))
			{
				S_ChangeMusic(level.Music, level.musicorder);
			}
		}
		else if (sc.Compare("skyname"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
		
			sky2texture = sky1texture = level.skytexture1 = level.skytexture2 = TexMan.GetTexture (sc.String, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_ReturnFirst);
			R_InitSkyMap ();
		}
		else if (sc.Compare("interpic"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
			level.info->ExitPic = sc.String;
		}
		else if (sc.Compare("gravity"))
		{
			sc.MustGetStringName("=");
			sc.MustGetNumber();
			level.gravity=sc.Number*8.f;
		}
		else if (sc.Compare("nextlevel"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
			level.NextMap = sc.String;
		}
		else if (sc.Compare("nextsecret"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
			level.NextSecretMap = sc.String;
		}
		else if (sc.Compare("drown"))
		{
			sc.MustGetStringName("=");
			sc.MustGetNumber();
			drownflag=!!sc.Number;
		}
		else if (sc.Compare("consolecmd"))
		{
			char * beg = strchr(line, '=')+1;
			while (*beg<' ') beg++;
			char * comm = strstr(beg, "//");
			if (comm) *comm=0;
			FS_EmulateCmd(beg);
		}
		else if (sc.Compare("ignore"))
		{
			sc.MustGetStringName("=");
			sc.MustGetNumber();
			IgnoreInfo=!!sc.Number;
		}
		// Ignore anything unknows
		sc.Close();
	}
}